

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::OneofWellKnownTypes::set_allocated_empty_field
          (OneofWellKnownTypes *this,Empty *empty_field)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  Empty *empty_field_local;
  OneofWellKnownTypes *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  clear_oneof_field(this);
  if (empty_field != (Empty *)0x0) {
    submessage_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)empty_field);
    message_arena = (Arena *)empty_field;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::GetOwnedMessage<google::protobuf::Empty>
                              (message_arena_00,empty_field,submessage_arena_00);
    }
    set_has_empty_field(this);
    (this->field_0)._impl_.oneof_field_.any_field_ = (Message *)message_arena;
  }
  return;
}

Assistant:

void OneofWellKnownTypes::set_allocated_empty_field(::google::protobuf::Empty* PROTOBUF_NULLABLE empty_field) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_oneof_field();
  if (empty_field) {
    ::google::protobuf::Arena* submessage_arena = reinterpret_cast<::google::protobuf::Message*>(empty_field)->GetArena();
    if (message_arena != submessage_arena) {
      empty_field = ::google::protobuf::internal::GetOwnedMessage(message_arena, empty_field, submessage_arena);
    }
    set_has_empty_field();
    _impl_.oneof_field_.empty_field_ = empty_field;
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.OneofWellKnownTypes.empty_field)
}